

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.cpp
# Opt level: O0

void __thiscall
SQCompilation::ForStatement::transformChildren(ForStatement *this,Transformer *transformer)

{
  long lVar1;
  long lVar2;
  Node *pNVar3;
  Expr *pEVar4;
  Node *pNVar5;
  LoopStatement *in_RSI;
  Node *in_RDI;
  
  lVar1._0_4_ = in_RDI[1]._coordinates.lineStart;
  lVar1._4_4_ = in_RDI[1]._coordinates.columnStart;
  pNVar5 = in_RDI;
  if (lVar1 != 0) {
    pNVar3 = Node::transform<SQCompilation::Transformer>(in_RDI,(Transformer *)in_RSI);
    *(Node **)&in_RDI[1]._coordinates = pNVar3;
  }
  lVar2._0_4_ = in_RDI[1]._coordinates.lineEnd;
  lVar2._4_4_ = in_RDI[1]._coordinates.columnEnd;
  if (lVar2 != 0) {
    pNVar3 = Node::transform<SQCompilation::Transformer>(pNVar5,(Transformer *)in_RSI);
    pEVar4 = Node::asExpression(pNVar3);
    *(Expr **)&in_RDI[1]._coordinates.lineEnd = pEVar4;
  }
  if (*(long *)&in_RDI[1]._op != 0) {
    pNVar5 = Node::transform<SQCompilation::Transformer>(pNVar5,(Transformer *)in_RSI);
    pEVar4 = Node::asExpression(pNVar5);
    *(Expr **)&in_RDI[1]._op = pEVar4;
  }
  LoopStatement::transformChildren(in_RSI,(Transformer *)in_RDI);
  return;
}

Assistant:

void ForStatement::transformChildren(Transformer *transformer) {
  if (_init) _init = _init->transform(transformer);
  if (_cond) _cond = _cond->transform(transformer)->asExpression();
  if (_mod) _mod = _mod->transform(transformer)->asExpression();

  LoopStatement::transformChildren(transformer);
}